

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::destroy
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this,Path *path,
          vector<long,_std::allocator<long>_> *versions)

{
  Client *client;
  anon_class_8_1_719aa419 local_100;
  JsonProducer local_f8;
  unordered_map<_e0ce3516_> local_d8;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Url local_50;
  vector<long,_std::allocator<long>_> *local_28;
  vector<long,_std::allocator<long>_> *versions_local;
  Path *path_local;
  KeyValue *this_local;
  
  local_28 = versions;
  versions_local = (vector<long,_std::allocator<long>_> *)path;
  path_local = (Path *)this;
  this_local = (KeyValue *)__return_storage_ptr__;
  if (this->version_ == v2) {
    client = this->client_;
    Vault::operator+(&local_90,"/v1",&this->mount_);
    std::operator+(&local_70,&local_90,"/destroy/");
    (*client->_vptr_Client[3])(&local_50,client,&local_70,versions_local);
    local_d8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_d8._M_h._M_rehash_policy._4_4_ = 0;
    local_d8._M_h._M_rehash_policy._M_next_resize = 0;
    local_d8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_d8._M_h._M_element_count = 0;
    local_d8._M_h._M_buckets = (__buckets_ptr)0x0;
    local_d8._M_h._M_bucket_count = 0;
    local_d8._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::unordered_map<$e0ce3516$>::unordered_map(&local_d8);
    local_100.versions = versions;
    std::
    function<std::__cxx11::string(std::unordered_map<std::__cxx11::string,std::variant<std::__cxx11::string,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::variant<std::__cxx11::string,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>>>const&)>
    ::
    function<Vault::KeyValue::destroy(Vault::Tiny<Vault::PathDetail,std::__cxx11::string>const&,std::vector<long,std::allocator<long>>)::__0,void>
              ((function<std::__cxx11::string(std::unordered_map<std::__cxx11::string,std::variant<std::__cxx11::string,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::variant<std::__cxx11::string,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>>>const&)>
                *)&local_f8,&local_100);
    HttpConsumer::post(__return_storage_ptr__,client,&local_50,&local_d8,&local_f8);
    std::function<$dedf0043$>::~function(&local_f8);
    std::unordered_map<$e0ce3516$>::~unordered_map(&local_d8);
    Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Tiny(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::KeyValue::destroy(const Vault::Path &path,
                         std::vector<int64_t> versions) {
  if (version_ != KeyValue::Version::v2) {
    return std::nullopt;
  }

  return Vault::HttpConsumer::post(
      client_, client_.getUrl("/v1" + mount_ + "/destroy/", path), Parameters{},
      [&]([[maybe_unused]] const Parameters &params) {
        nlohmann::json j;
        j["versions"] = versions;
        return j.dump();
      });
}